

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O3

void KosinskiDecompress(KosinskiDecompressCallbacks *callbacks,cc_bool print_debug_information)

{
  uchar uVar1;
  size_t sVar2;
  cc_bool cVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  
  write_position = 0;
  read_position = 1;
  uVar5 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
  read_position = read_position + 1;
  uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
  descriptor = uVar6 << 8 | uVar5;
  descriptor_bits_remaining = 0x10;
  while( true ) {
    while (cVar3 = PopDescriptor(callbacks), sVar2 = read_position, cVar3 != '\0') {
      read_position = read_position + 1;
      uVar5 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Literal match: At %lX, value %X\n",sVar2,write_position,
                (ulong)(byte)uVar5);
      }
      (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)uVar5 & 0xff);
      uVar6 = (uint)write_position;
      write_position = write_position + 1;
      backsearch_buffer[uVar6 & 0x1fff] = (byte)uVar5;
    }
    cVar3 = PopDescriptor(callbacks);
    sVar2 = read_position;
    if (cVar3 == '\0') {
      cVar3 = PopDescriptor(callbacks);
      bVar4 = PopDescriptor(callbacks);
      read_position = read_position + 1;
      uVar5 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      uVar5 = (uVar5 ^ 0xff) + 1;
      uVar8 = (ulong)bVar4 + (ulong)(cVar3 != '\0') * 2 + 2;
      sVar7 = write_position;
      if (print_debug_information == '\0') goto LAB_00102251;
      KosinskiDecompress_cold_1();
      sVar7 = write_position;
      goto LAB_00102251;
    }
    read_position = read_position + 1;
    uVar5 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    read_position = read_position + 1;
    uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    uVar5 = 0x2000 - (uVar5 & 0xff | (uVar6 & 0xf8) << 5);
    if ((uVar6 & 7) != 0) {
      uVar8 = (ulong)((uVar6 & 7) + 2);
      sVar7 = write_position;
      if (print_debug_information == '\0') goto LAB_00102251;
      fprintf(_stderr,"%lX - Full match: At %lX, src %lX, len %lX\n",sVar2,write_position,
              write_position - uVar5,uVar8);
      sVar7 = write_position;
      goto LAB_00102251;
    }
    read_position = read_position + 1;
    uVar6 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    if (uVar6 == 0) break;
    uVar8 = (ulong)(uVar6 + 1);
    if (uVar6 + 1 == 2) {
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - 0xA000 boundary flag: At %lX, src %lX\n",sVar2,write_position,
                write_position - uVar5);
      }
    }
    else {
      sVar7 = write_position;
      if (print_debug_information != '\0') {
        fprintf(_stderr,"%lX - Extended full match: At %lX, src %lX, len %lX\n",sVar2,write_position
                ,write_position - uVar5,uVar8);
        sVar7 = write_position;
      }
      for (; uVar8 != 0; uVar8 = uVar8 - 1) {
LAB_00102251:
        uVar1 = backsearch_buffer[(int)sVar7 - uVar5 & 0x1fff];
        (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)uVar1);
        sVar7 = write_position + 1;
        uVar6 = (uint)write_position;
        write_position = sVar7;
        backsearch_buffer[uVar6 & 0x1fff] = uVar1;
      }
    }
  }
  if (print_debug_information != '\0') {
    fprintf(_stderr,"%lX - Terminator: At %lX, src %lX\n",sVar2,write_position,
            write_position - uVar5);
    return;
  }
  return;
}

Assistant:

void KosinskiDecompress(const KosinskiDecompressCallbacks* const callbacks, const cc_bool print_debug_information)
{
	read_position = 0;
	write_position = 0;

	GetDescriptor(callbacks);

	for (;;)
	{
		if (PopDescriptor(callbacks))
		{
			const size_t position = read_position;

			const unsigned char byte = ReadByte(callbacks);

			if (print_debug_information)
				fprintf(stderr, "%lX - Literal match: At %lX, value %X\n", (unsigned long)position, (unsigned long)write_position, byte);

			WriteByte(byte, callbacks);
		}
		else
		{
			unsigned int distance;
			size_t count;

			if (PopDescriptor(callbacks))
			{
				const size_t position = read_position;

				const unsigned char low_byte = ReadByte(callbacks);
				const unsigned char high_byte = ReadByte(callbacks);

				distance = ((high_byte & 0xF8) << 5) | low_byte;
				distance = (distance ^ 0x1FFF) + 1; /* Convert from negative two's-complement to positive */
				count = high_byte & 7;

				if (count != 0)
				{
					count += 2;

					if (print_debug_information)
						fprintf(stderr, "%lX - Full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
				}
				else
				{
					count = ReadByte(callbacks) + 1;

					if (count == 1)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Terminator: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						break;
					}
					else if (count == 2)
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - 0xA000 boundary flag: At %lX, src %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance));

						continue;
					}
					else
					{
						if (print_debug_information)
							fprintf(stderr, "%lX - Extended full match: At %lX, src %lX, len %lX\n", (unsigned long)position, (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
					}
				}
			}
			else
			{
				count = 2;

				if (PopDescriptor(callbacks))
					count += 2;
				if (PopDescriptor(callbacks))
					count += 1;

				distance = (ReadByte(callbacks) ^ 0xFF) + 1; /* Convert from negative two's-complement to positive */

				if (print_debug_information)
					fprintf(stderr, "%lX - Inline match: At %lX, src %lX, len %lX\n", (unsigned long)(read_position - 1), (unsigned long)write_position, (unsigned long)(write_position - distance), (unsigned long)count);
			}

			while (count-- != 0)
				WriteByte(backsearch_buffer[(write_position - distance) % SLIDING_WINDOW_SIZE], callbacks);
		}
	}
}